

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkDeviceSize __thiscall VmaAllocation_T::GetOffset(VmaAllocation_T *this)

{
  VmaBlockMetadata *pVVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (this->m_Type == '\x01') {
    pVVar1 = ((this->field_0).m_BlockAllocation.m_Block)->m_pMetadata;
    iVar2 = (*pVVar1->_vptr_VmaBlockMetadata[9])
                      (pVVar1,(this->field_0).m_BlockAllocation.m_AllocHandle);
    return CONCAT44(extraout_var,iVar2);
  }
  return 0;
}

Assistant:

VkDeviceSize VmaAllocation_T::GetOffset() const
{
    switch (m_Type)
    {
    case ALLOCATION_TYPE_BLOCK:
        return m_BlockAllocation.m_Block->m_pMetadata->GetAllocationOffset(m_BlockAllocation.m_AllocHandle);
    case ALLOCATION_TYPE_DEDICATED:
        return 0;
    default:
        VMA_ASSERT(0);
        return 0;
    }
}